

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

int * __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::addNode
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,BSTNode **t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          bool *heightFlag)

{
  int iVar1;
  int *piVar2;
  BSTNode *pBVar3;
  uint bfDelta;
  byte bVar4;
  bool bVar5;
  
  *heightFlag = false;
  if (*t == (BSTNode *)0x0) {
    pBVar3 = (BSTNode *)operator_new(0x40);
    (pBVar3->key).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pBVar3->key).field_2 + 8) = 0;
    *(undefined8 *)&pBVar3->value = 0;
    pBVar3->left = (BSTNode *)0x0;
    pBVar3->right = (BSTNode *)0x0;
    *(undefined8 *)&pBVar3->bf = 0;
    (pBVar3->key)._M_dataplus._M_p = (pointer)&(pBVar3->key).field_2;
    (pBVar3->key)._M_string_length = 0;
    *t = pBVar3;
    std::__cxx11::string::_M_assign((string *)pBVar3);
    pBVar3 = *t;
    pBVar3->value = 0;
    pBVar3->bf = 0;
    pBVar3->right = (BSTNode *)0x0;
    (*t)->left = (BSTNode *)0x0;
    *heightFlag = true;
    this->nodeCount = this->nodeCount + 1;
  }
  else {
    iVar1 = compareKeys(this,key,&(*t)->key);
    if (iVar1 != 0) {
      if (iVar1 < 0) {
        piVar2 = addNode(this,&(*t)->left,key,heightFlag);
        bVar4 = *heightFlag;
        bfDelta = -(uint)bVar4;
      }
      else {
        piVar2 = addNode(this,&(*t)->right,key,heightFlag);
        bVar4 = *heightFlag;
        bfDelta = (uint)bVar4;
      }
      updateBF(this,t,bfDelta);
      if (bVar4 == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = (*t)->bf != 0;
      }
      *heightFlag = bVar5;
      return piVar2;
    }
  }
  return &(*t)->value;
}

Assistant:

ValueType *addNode(BSTNode * & t, const KeyType & key, bool & heightFlag) {
      heightFlag = false;
      if (t == NULL)  {
         t = new BSTNode();
         t->key = key;
         t->value = ValueType();
         t->bf = BST_IN_BALANCE;
         t->left = t->right = NULL;
         heightFlag = true;
         nodeCount++;
         return &t->value;
      }
      int sign = compareKeys(key, t->key);
      if (sign == 0) return &t->value;
      ValueType *vp = NULL;
      int bfDelta = BST_IN_BALANCE;
      if (sign < 0) {
         vp = addNode(t->left, key, heightFlag);
         if (heightFlag) bfDelta = BST_LEFT_HEAVY;
      } else {
         vp = addNode(t->right, key, heightFlag);
         if (heightFlag) bfDelta = BST_RIGHT_HEAVY;
      }
      updateBF(t, bfDelta);
      heightFlag = (bfDelta != 0 && t->bf != BST_IN_BALANCE);
      return vp;
   }